

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sorter.h
# Opt level: O3

void soplex::
     SPxQuicksort<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>::Breakpoint,soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>::BreakpointCompare>
               (Breakpoint *keys,int end,BreakpointCompare *compare,int start,bool type)

{
  Breakpoint *pBVar1;
  uint *puVar2;
  bool bVar3;
  bool bVar4;
  fpclass_type fVar5;
  int32_t iVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  undefined8 uVar20;
  undefined8 uVar21;
  undefined8 uVar22;
  undefined8 uVar23;
  undefined8 uVar24;
  undefined8 uVar25;
  undefined8 uVar26;
  undefined8 uVar27;
  undefined8 uVar28;
  undefined8 uVar29;
  undefined8 uVar30;
  BreakpointSource BVar31;
  int32_t iVar32;
  fpclass_type fVar33;
  int32_t iVar34;
  int iVar35;
  BreakpointSource BVar36;
  int iVar37;
  long lVar38;
  long lVar39;
  uint uVar40;
  int iVar41;
  uint uVar42;
  int *piVar43;
  int start_00;
  ulong uVar44;
  uint uVar45;
  long lVar47;
  int iVar48;
  ulong uVar49;
  ulong uVar50;
  int iVar51;
  uint uVar52;
  ulong uVar53;
  type t;
  cpp_dec_float<100U,_int,_void> local_548;
  Breakpoint local_4f8;
  Breakpoint local_498;
  Breakpoint local_438;
  Breakpoint local_3d8;
  Breakpoint local_378;
  Breakpoint local_318;
  Breakpoint local_2b8;
  Breakpoint local_258;
  Breakpoint local_1f8;
  Breakpoint local_198;
  Breakpoint local_138;
  Breakpoint local_d8;
  cpp_dec_float<100U,_int,_void> local_80;
  ulong uVar46;
  
  uVar44 = (ulong)(uint)start;
  if (start + 1 < end) {
    uVar45 = end - 1;
    uVar46 = (ulong)uVar45;
    uVar40 = uVar45 - start;
    if (0x18 < (int)uVar40) {
LAB_00490729:
      start_00 = (int)uVar44;
      iVar41 = (uVar40 >> 1) + start_00;
      pBVar1 = keys + iVar41;
      uVar7 = *(undefined8 *)keys[iVar41].val.m_backend.data._M_elems;
      uVar8 = *(undefined8 *)(keys[iVar41].val.m_backend.data._M_elems + 2);
      puVar2 = keys[iVar41].val.m_backend.data._M_elems + 4;
      uVar9 = *(undefined8 *)puVar2;
      uVar10 = *(undefined8 *)(puVar2 + 2);
      puVar2 = keys[iVar41].val.m_backend.data._M_elems + 8;
      uVar11 = *(undefined8 *)puVar2;
      uVar12 = *(undefined8 *)(puVar2 + 2);
      puVar2 = keys[iVar41].val.m_backend.data._M_elems + 0xc;
      uVar13 = *(undefined8 *)puVar2;
      uVar14 = *(undefined8 *)(puVar2 + 2);
      iVar48 = keys[iVar41].val.m_backend.exp;
      bVar3 = keys[iVar41].val.m_backend.neg;
      fVar5 = keys[iVar41].val.m_backend.fpclass;
      iVar6 = keys[iVar41].val.m_backend.prec_elem;
      uVar30._0_4_ = keys[iVar41].idx;
      uVar30._4_4_ = keys[iVar41].src;
      lVar38 = (long)start_00;
      uVar45 = (uint)uVar46;
      lVar39 = (long)(int)uVar45;
      uVar49 = uVar44;
      uVar53 = uVar46;
      do {
        iVar41 = (int)uVar49;
        iVar51 = (int)uVar53;
        uVar50 = uVar49;
        if ((type & 1U) == 0) {
          if (iVar41 < (int)uVar45) {
            piVar43 = &keys[iVar41].idx;
            do {
              local_198.val.m_backend.data._M_elems._0_8_ =
                   *(undefined8 *)(((Breakpoint *)(piVar43 + -0x14))->val).m_backend.data._M_elems;
              local_198.val.m_backend.data._M_elems._8_8_ = *(undefined8 *)(piVar43 + -0x12);
              local_198.val.m_backend.data._M_elems._16_8_ = *(undefined8 *)(piVar43 + -0x10);
              local_198.val.m_backend.data._M_elems._24_8_ = *(undefined8 *)(piVar43 + -0xe);
              local_198.val.m_backend.data._M_elems._32_8_ = *(undefined8 *)(piVar43 + -0xc);
              local_198.val.m_backend.data._M_elems._40_8_ = *(undefined8 *)(piVar43 + -10);
              local_198.val.m_backend.data._M_elems._48_8_ = *(undefined8 *)(piVar43 + -8);
              local_198.val.m_backend.data._M_elems._56_8_ = *(undefined8 *)(piVar43 + -6);
              local_198.val.m_backend.exp = piVar43[-4];
              local_198.val.m_backend.neg = *(bool *)(piVar43 + -3);
              local_198.val.m_backend._72_8_ = *(undefined8 *)(piVar43 + -2);
              local_198._80_8_ = *(undefined8 *)piVar43;
              local_3d8.val.m_backend.data._M_elems._0_8_ = uVar7;
              local_3d8.val.m_backend.data._M_elems._8_8_ = uVar8;
              local_3d8.val.m_backend.data._M_elems._16_8_ = uVar9;
              local_3d8.val.m_backend.data._M_elems._24_8_ = uVar10;
              local_3d8.val.m_backend.data._M_elems._32_8_ = uVar11;
              local_3d8.val.m_backend.data._M_elems._40_8_ = uVar12;
              local_3d8.val.m_backend.data._M_elems._48_8_ = uVar13;
              local_3d8.val.m_backend.data._M_elems._56_8_ = uVar14;
              local_3d8.val.m_backend.exp = iVar48;
              local_3d8.val.m_backend.neg = bVar3;
              local_3d8.val.m_backend.fpclass = fVar5;
              local_3d8.val.m_backend.prec_elem = iVar6;
              local_3d8._80_8_ = uVar30;
              SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::BreakpointCompare::operator()
                        ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)&local_548,compare,&local_198,&local_3d8);
              uVar50 = uVar49;
              if (local_548.fpclass == cpp_dec_float_NaN) break;
              boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::
              cpp_dec_float<long_long>(&local_80,0,(type *)0x0);
              iVar41 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                                 (&local_548,&local_80);
              if (0 < iVar41) break;
              uVar40 = (int)uVar49 + 1;
              uVar49 = (ulong)uVar40;
              piVar43 = piVar43 + 0x16;
              uVar50 = uVar46;
            } while (uVar45 != uVar40);
          }
          if (start_00 < iVar51) {
            uVar53 = (ulong)iVar51;
            piVar43 = &keys[uVar53].idx;
            do {
              local_1f8.val.m_backend.data._M_elems._0_8_ =
                   *(undefined8 *)(((Breakpoint *)(piVar43 + -0x14))->val).m_backend.data._M_elems;
              local_1f8.val.m_backend.data._M_elems._8_8_ = *(undefined8 *)(piVar43 + -0x12);
              local_1f8.val.m_backend.data._M_elems._16_8_ = *(undefined8 *)(piVar43 + -0x10);
              local_1f8.val.m_backend.data._M_elems._24_8_ = *(undefined8 *)(piVar43 + -0xe);
              local_1f8.val.m_backend.data._M_elems._32_8_ = *(undefined8 *)(piVar43 + -0xc);
              local_1f8.val.m_backend.data._M_elems._40_8_ = *(undefined8 *)(piVar43 + -10);
              local_1f8.val.m_backend.data._M_elems._48_8_ = *(undefined8 *)(piVar43 + -8);
              local_1f8.val.m_backend.data._M_elems._56_8_ = *(undefined8 *)(piVar43 + -6);
              local_1f8.val.m_backend.exp = piVar43[-4];
              local_1f8.val.m_backend.neg = *(bool *)(piVar43 + -3);
              local_1f8.val.m_backend._72_8_ = *(undefined8 *)(piVar43 + -2);
              local_1f8._80_8_ = *(undefined8 *)piVar43;
              local_438.val.m_backend.data._M_elems._0_8_ = uVar7;
              local_438.val.m_backend.data._M_elems._8_8_ = uVar8;
              local_438.val.m_backend.data._M_elems._16_8_ = uVar9;
              local_438.val.m_backend.data._M_elems._24_8_ = uVar10;
              local_438.val.m_backend.data._M_elems._32_8_ = uVar11;
              local_438.val.m_backend.data._M_elems._40_8_ = uVar12;
              local_438.val.m_backend.data._M_elems._48_8_ = uVar13;
              local_438.val.m_backend.data._M_elems._56_8_ = uVar14;
              local_438.val.m_backend.exp = iVar48;
              local_438.val.m_backend.neg = bVar3;
              local_438.val.m_backend.fpclass = fVar5;
              local_438.val.m_backend.prec_elem = iVar6;
              local_438._80_8_ = uVar30;
              SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::BreakpointCompare::operator()
                        ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)&local_548,compare,&local_1f8,&local_438);
              if (local_548.fpclass == cpp_dec_float_NaN) break;
              boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::
              cpp_dec_float<long_long>(&local_80,0,(type *)0x0);
              iVar41 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                                 (&local_548,&local_80);
              if (iVar41 < 1) break;
              uVar53 = uVar53 - 1;
              piVar43 = piVar43 + -0x16;
            } while (lVar38 < (long)uVar53);
          }
        }
        else {
          if (iVar41 < (int)uVar45) {
            piVar43 = &keys[iVar41].idx;
            lVar47 = 0;
            do {
              local_d8.val.m_backend.data._M_elems._0_8_ =
                   *(undefined8 *)(((Breakpoint *)(piVar43 + -0x14))->val).m_backend.data._M_elems;
              local_d8.val.m_backend.data._M_elems._8_8_ = *(undefined8 *)(piVar43 + -0x12);
              local_d8.val.m_backend.data._M_elems._16_8_ = *(undefined8 *)(piVar43 + -0x10);
              local_d8.val.m_backend.data._M_elems._24_8_ = *(undefined8 *)(piVar43 + -0xe);
              local_d8.val.m_backend.data._M_elems._32_8_ = *(undefined8 *)(piVar43 + -0xc);
              local_d8.val.m_backend.data._M_elems._40_8_ = *(undefined8 *)(piVar43 + -10);
              local_d8.val.m_backend.data._M_elems._48_8_ = *(undefined8 *)(piVar43 + -8);
              local_d8.val.m_backend.data._M_elems._56_8_ = *(undefined8 *)(piVar43 + -6);
              local_d8.val.m_backend.exp = piVar43[-4];
              local_d8.val.m_backend.neg = *(bool *)(piVar43 + -3);
              local_d8.val.m_backend._72_8_ = *(undefined8 *)(piVar43 + -2);
              local_d8._80_8_ = *(undefined8 *)piVar43;
              local_318.val.m_backend.data._M_elems._0_8_ = uVar7;
              local_318.val.m_backend.data._M_elems._8_8_ = uVar8;
              local_318.val.m_backend.data._M_elems._16_8_ = uVar9;
              local_318.val.m_backend.data._M_elems._24_8_ = uVar10;
              local_318.val.m_backend.data._M_elems._32_8_ = uVar11;
              local_318.val.m_backend.data._M_elems._40_8_ = uVar12;
              local_318.val.m_backend.data._M_elems._48_8_ = uVar13;
              local_318.val.m_backend.data._M_elems._56_8_ = uVar14;
              local_318.val.m_backend.exp = iVar48;
              local_318.val.m_backend.neg = bVar3;
              local_318.val.m_backend.fpclass = fVar5;
              local_318.val.m_backend.prec_elem = iVar6;
              local_318._80_8_ = uVar30;
              SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::BreakpointCompare::operator()
                        ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)&local_548,compare,&local_d8,&local_318);
              if (local_548.fpclass == cpp_dec_float_NaN) {
                uVar50 = (ulong)(uint)(iVar41 - (int)lVar47);
                break;
              }
              boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::
              cpp_dec_float<long_long>(&local_80,0,(type *)0x0);
              iVar37 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                                 (&local_548,&local_80);
              if (-1 < iVar37) {
                uVar50 = (ulong)(uint)(iVar41 - (int)lVar47);
                break;
              }
              lVar47 = lVar47 + -1;
              piVar43 = piVar43 + 0x16;
              uVar50 = uVar46;
            } while (iVar41 - lVar39 != lVar47);
          }
          if (start_00 < iVar51) {
            uVar53 = (ulong)iVar51;
            piVar43 = &keys[uVar53].idx;
            do {
              local_138.val.m_backend.data._M_elems._0_8_ =
                   *(undefined8 *)(((Breakpoint *)(piVar43 + -0x14))->val).m_backend.data._M_elems;
              local_138.val.m_backend.data._M_elems._8_8_ = *(undefined8 *)(piVar43 + -0x12);
              local_138.val.m_backend.data._M_elems._16_8_ = *(undefined8 *)(piVar43 + -0x10);
              local_138.val.m_backend.data._M_elems._24_8_ = *(undefined8 *)(piVar43 + -0xe);
              local_138.val.m_backend.data._M_elems._32_8_ = *(undefined8 *)(piVar43 + -0xc);
              local_138.val.m_backend.data._M_elems._40_8_ = *(undefined8 *)(piVar43 + -10);
              local_138.val.m_backend.data._M_elems._48_8_ = *(undefined8 *)(piVar43 + -8);
              local_138.val.m_backend.data._M_elems._56_8_ = *(undefined8 *)(piVar43 + -6);
              local_138.val.m_backend.exp = piVar43[-4];
              local_138.val.m_backend.neg = *(bool *)(piVar43 + -3);
              local_138.val.m_backend._72_8_ = *(undefined8 *)(piVar43 + -2);
              local_138._80_8_ = *(undefined8 *)piVar43;
              local_378.val.m_backend.data._M_elems._0_8_ = uVar7;
              local_378.val.m_backend.data._M_elems._8_8_ = uVar8;
              local_378.val.m_backend.data._M_elems._16_8_ = uVar9;
              local_378.val.m_backend.data._M_elems._24_8_ = uVar10;
              local_378.val.m_backend.data._M_elems._32_8_ = uVar11;
              local_378.val.m_backend.data._M_elems._40_8_ = uVar12;
              local_378.val.m_backend.data._M_elems._48_8_ = uVar13;
              local_378.val.m_backend.data._M_elems._56_8_ = uVar14;
              local_378.val.m_backend.exp = iVar48;
              local_378.val.m_backend.neg = bVar3;
              local_378.val.m_backend.fpclass = fVar5;
              local_378.val.m_backend.prec_elem = iVar6;
              local_378._80_8_ = uVar30;
              SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::BreakpointCompare::operator()
                        ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)&local_548,compare,&local_138,&local_378);
              if (local_548.fpclass == cpp_dec_float_NaN) break;
              boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::
              cpp_dec_float<long_long>(&local_80,0,(type *)0x0);
              iVar41 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                                 (&local_548,&local_80);
              if (iVar41 < 0) break;
              uVar53 = uVar53 - 1;
              piVar43 = piVar43 + -0x16;
            } while (lVar38 < (long)uVar53);
          }
        }
        iVar41 = (int)uVar50;
        iVar51 = (int)uVar53;
        if (iVar51 <= iVar41) goto LAB_00490ef8;
        uVar15 = *(undefined8 *)keys[iVar41].val.m_backend.data._M_elems;
        uVar16 = *(undefined8 *)(keys[iVar41].val.m_backend.data._M_elems + 2);
        puVar2 = keys[iVar41].val.m_backend.data._M_elems + 4;
        uVar17 = *(undefined8 *)puVar2;
        uVar18 = *(undefined8 *)(puVar2 + 2);
        puVar2 = keys[iVar41].val.m_backend.data._M_elems + 8;
        uVar19 = *(undefined8 *)puVar2;
        uVar20 = *(undefined8 *)(puVar2 + 2);
        puVar2 = keys[iVar41].val.m_backend.data._M_elems + 0xc;
        uVar21 = *(undefined8 *)puVar2;
        uVar22 = *(undefined8 *)(puVar2 + 2);
        iVar37 = keys[iVar41].val.m_backend.exp;
        bVar4 = keys[iVar41].val.m_backend.neg;
        iVar35 = keys[iVar41].idx;
        BVar36 = keys[iVar41].src;
        uVar23 = *(undefined8 *)(keys[iVar51].val.m_backend.data._M_elems + 2);
        puVar2 = keys[iVar51].val.m_backend.data._M_elems + 4;
        uVar24 = *(undefined8 *)puVar2;
        uVar25 = *(undefined8 *)(puVar2 + 2);
        puVar2 = keys[iVar51].val.m_backend.data._M_elems + 8;
        uVar26 = *(undefined8 *)puVar2;
        uVar27 = *(undefined8 *)(puVar2 + 2);
        puVar2 = keys[iVar51].val.m_backend.data._M_elems + 0xc;
        uVar28 = *(undefined8 *)puVar2;
        uVar29 = *(undefined8 *)(puVar2 + 2);
        *(undefined8 *)keys[iVar41].val.m_backend.data._M_elems =
             *(undefined8 *)keys[iVar51].val.m_backend.data._M_elems;
        *(undefined8 *)(keys[iVar41].val.m_backend.data._M_elems + 2) = uVar23;
        puVar2 = keys[iVar41].val.m_backend.data._M_elems + 4;
        *(undefined8 *)puVar2 = uVar24;
        *(undefined8 *)(puVar2 + 2) = uVar25;
        puVar2 = keys[iVar41].val.m_backend.data._M_elems + 8;
        *(undefined8 *)puVar2 = uVar26;
        *(undefined8 *)(puVar2 + 2) = uVar27;
        puVar2 = keys[iVar41].val.m_backend.data._M_elems + 0xc;
        *(undefined8 *)puVar2 = uVar28;
        *(undefined8 *)(puVar2 + 2) = uVar29;
        keys[iVar41].val.m_backend.exp = keys[iVar51].val.m_backend.exp;
        keys[iVar41].val.m_backend.neg = keys[iVar51].val.m_backend.neg;
        BVar31 = keys[iVar51].src;
        keys[iVar41].idx = keys[iVar51].idx;
        keys[iVar41].src = BVar31;
        puVar2 = keys[iVar51].val.m_backend.data._M_elems + 0xc;
        *(undefined8 *)puVar2 = uVar21;
        *(undefined8 *)(puVar2 + 2) = uVar22;
        puVar2 = keys[iVar51].val.m_backend.data._M_elems + 8;
        *(undefined8 *)puVar2 = uVar19;
        *(undefined8 *)(puVar2 + 2) = uVar20;
        puVar2 = keys[iVar51].val.m_backend.data._M_elems + 4;
        *(undefined8 *)puVar2 = uVar17;
        *(undefined8 *)(puVar2 + 2) = uVar18;
        *(undefined8 *)keys[iVar51].val.m_backend.data._M_elems = uVar15;
        *(undefined8 *)(keys[iVar51].val.m_backend.data._M_elems + 2) = uVar16;
        keys[iVar51].val.m_backend.exp = iVar37;
        keys[iVar51].val.m_backend.neg = bVar4;
        fVar33 = keys[iVar41].val.m_backend.fpclass;
        iVar34 = keys[iVar41].val.m_backend.prec_elem;
        iVar32 = keys[iVar51].val.m_backend.prec_elem;
        keys[iVar41].val.m_backend.fpclass = keys[iVar51].val.m_backend.fpclass;
        keys[iVar41].val.m_backend.prec_elem = iVar32;
        keys[iVar51].val.m_backend.fpclass = fVar33;
        keys[iVar51].val.m_backend.prec_elem = iVar34;
        keys[iVar51].idx = iVar35;
        keys[iVar51].src = BVar36;
        uVar49 = (ulong)(iVar41 + 1);
        uVar53 = (ulong)(iVar51 - 1);
      } while( true );
    }
LAB_00491428:
    if (0 < (int)uVar40) {
      SPxShellsort<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>::Breakpoint,soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>::BreakpointCompare>
                (keys,uVar45,compare,start);
    }
  }
  return;
LAB_00490ef8:
  if ((type & 1U) == 0) {
    if (start_00 < iVar51) {
      uVar53 = (ulong)iVar51;
      piVar43 = &keys[uVar53].idx;
      do {
        local_2b8.val.m_backend.data._M_elems._0_8_ =
             *(undefined8 *)(((Breakpoint *)(piVar43 + -0x14))->val).m_backend.data._M_elems;
        local_2b8.val.m_backend.data._M_elems._8_8_ = *(undefined8 *)(piVar43 + -0x12);
        local_2b8.val.m_backend.data._M_elems._16_8_ = *(undefined8 *)(piVar43 + -0x10);
        local_2b8.val.m_backend.data._M_elems._24_8_ = *(undefined8 *)(piVar43 + -0xe);
        local_2b8.val.m_backend.data._M_elems._32_8_ = *(undefined8 *)(piVar43 + -0xc);
        local_2b8.val.m_backend.data._M_elems._40_8_ = *(undefined8 *)(piVar43 + -10);
        local_2b8.val.m_backend.data._M_elems._48_8_ = *(undefined8 *)(piVar43 + -8);
        local_2b8.val.m_backend.data._M_elems._56_8_ = *(undefined8 *)(piVar43 + -6);
        local_2b8.val.m_backend.exp = piVar43[-4];
        local_2b8.val.m_backend.neg = *(bool *)(piVar43 + -3);
        local_2b8.val.m_backend._72_8_ = *(undefined8 *)(piVar43 + -2);
        local_2b8._80_8_ = *(undefined8 *)piVar43;
        local_4f8.val.m_backend.data._M_elems._0_8_ = uVar7;
        local_4f8.val.m_backend.data._M_elems._8_8_ = uVar8;
        local_4f8.val.m_backend.data._M_elems._16_8_ = uVar9;
        local_4f8.val.m_backend.data._M_elems._24_8_ = uVar10;
        local_4f8.val.m_backend.data._M_elems._32_8_ = uVar11;
        local_4f8.val.m_backend.data._M_elems._40_8_ = uVar12;
        local_4f8.val.m_backend.data._M_elems._48_8_ = uVar13;
        local_4f8.val.m_backend.data._M_elems._56_8_ = uVar14;
        local_4f8.val.m_backend.exp = iVar48;
        local_4f8.val.m_backend.neg = bVar3;
        local_4f8.val.m_backend.fpclass = fVar5;
        local_4f8.val.m_backend.prec_elem = iVar6;
        local_4f8._80_8_ = uVar30;
        SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::BreakpointCompare::operator()
                  ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)&local_548,compare,&local_4f8,&local_2b8);
        if (local_548.fpclass == cpp_dec_float_NaN) break;
        boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<long_long>
                  (&local_80,0,(type *)0x0);
        iVar41 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                           (&local_548,&local_80);
        if (0 < iVar41) break;
        uVar53 = uVar53 - 1;
        piVar43 = piVar43 + -0x16;
      } while (lVar38 < (long)uVar53);
    }
    if ((uint)uVar53 == uVar45) {
      uVar30 = *(undefined8 *)keys[lVar39].val.m_backend.data._M_elems;
      uVar7 = *(undefined8 *)(keys[lVar39].val.m_backend.data._M_elems + 2);
      puVar2 = keys[lVar39].val.m_backend.data._M_elems + 4;
      uVar8 = *(undefined8 *)puVar2;
      uVar9 = *(undefined8 *)(puVar2 + 2);
      puVar2 = keys[lVar39].val.m_backend.data._M_elems + 8;
      uVar10 = *(undefined8 *)puVar2;
      uVar11 = *(undefined8 *)(puVar2 + 2);
      puVar2 = keys[lVar39].val.m_backend.data._M_elems + 0xc;
      uVar12 = *(undefined8 *)puVar2;
      uVar13 = *(undefined8 *)(puVar2 + 2);
      iVar48 = keys[lVar39].val.m_backend.exp;
      bVar3 = keys[lVar39].val.m_backend.neg;
      iVar41 = keys[lVar39].idx;
      BVar36 = keys[lVar39].src;
      uVar14 = *(undefined8 *)((pBVar1->val).m_backend.data._M_elems + 2);
      uVar15 = *(undefined8 *)((pBVar1->val).m_backend.data._M_elems + 4);
      uVar16 = *(undefined8 *)((pBVar1->val).m_backend.data._M_elems + 6);
      uVar17 = *(undefined8 *)((pBVar1->val).m_backend.data._M_elems + 8);
      uVar18 = *(undefined8 *)((pBVar1->val).m_backend.data._M_elems + 10);
      uVar19 = *(undefined8 *)((pBVar1->val).m_backend.data._M_elems + 0xc);
      uVar20 = *(undefined8 *)((pBVar1->val).m_backend.data._M_elems + 0xe);
      *(undefined8 *)keys[lVar39].val.m_backend.data._M_elems =
           *(undefined8 *)(pBVar1->val).m_backend.data._M_elems;
      *(undefined8 *)(keys[lVar39].val.m_backend.data._M_elems + 2) = uVar14;
      puVar2 = keys[lVar39].val.m_backend.data._M_elems + 4;
      *(undefined8 *)puVar2 = uVar15;
      *(undefined8 *)(puVar2 + 2) = uVar16;
      puVar2 = keys[lVar39].val.m_backend.data._M_elems + 8;
      *(undefined8 *)puVar2 = uVar17;
      *(undefined8 *)(puVar2 + 2) = uVar18;
      puVar2 = keys[lVar39].val.m_backend.data._M_elems + 0xc;
      *(undefined8 *)puVar2 = uVar19;
      *(undefined8 *)(puVar2 + 2) = uVar20;
      keys[lVar39].val.m_backend.exp = (pBVar1->val).m_backend.exp;
      keys[lVar39].val.m_backend.neg = (pBVar1->val).m_backend.neg;
      BVar31 = pBVar1->src;
      keys[lVar39].idx = pBVar1->idx;
      keys[lVar39].src = BVar31;
      *(undefined8 *)((pBVar1->val).m_backend.data._M_elems + 0xc) = uVar12;
      *(undefined8 *)((pBVar1->val).m_backend.data._M_elems + 0xe) = uVar13;
      *(undefined8 *)((pBVar1->val).m_backend.data._M_elems + 8) = uVar10;
      *(undefined8 *)((pBVar1->val).m_backend.data._M_elems + 10) = uVar11;
      *(undefined8 *)((pBVar1->val).m_backend.data._M_elems + 4) = uVar8;
      *(undefined8 *)((pBVar1->val).m_backend.data._M_elems + 6) = uVar9;
      *(undefined8 *)(pBVar1->val).m_backend.data._M_elems = uVar30;
      *(undefined8 *)((pBVar1->val).m_backend.data._M_elems + 2) = uVar7;
      (pBVar1->val).m_backend.exp = iVar48;
      (pBVar1->val).m_backend.neg = bVar3;
      fVar5 = keys[lVar39].val.m_backend.fpclass;
      iVar32 = keys[lVar39].val.m_backend.prec_elem;
      iVar6 = (pBVar1->val).m_backend.prec_elem;
      keys[lVar39].val.m_backend.fpclass = (pBVar1->val).m_backend.fpclass;
      keys[lVar39].val.m_backend.prec_elem = iVar6;
      (pBVar1->val).m_backend.fpclass = fVar5;
      (pBVar1->val).m_backend.prec_elem = iVar32;
      pBVar1->idx = iVar41;
      pBVar1->src = BVar36;
      uVar53 = (ulong)(uVar45 - 1);
    }
  }
  else {
    uVar49 = uVar50;
    if (iVar41 < (int)uVar45) {
      piVar43 = &keys[iVar41].idx;
      do {
        local_258.val.m_backend.data._M_elems._0_8_ =
             *(undefined8 *)(((Breakpoint *)(piVar43 + -0x14))->val).m_backend.data._M_elems;
        local_258.val.m_backend.data._M_elems._8_8_ = *(undefined8 *)(piVar43 + -0x12);
        local_258.val.m_backend.data._M_elems._16_8_ = *(undefined8 *)(piVar43 + -0x10);
        local_258.val.m_backend.data._M_elems._24_8_ = *(undefined8 *)(piVar43 + -0xe);
        local_258.val.m_backend.data._M_elems._32_8_ = *(undefined8 *)(piVar43 + -0xc);
        local_258.val.m_backend.data._M_elems._40_8_ = *(undefined8 *)(piVar43 + -10);
        local_258.val.m_backend.data._M_elems._48_8_ = *(undefined8 *)(piVar43 + -8);
        local_258.val.m_backend.data._M_elems._56_8_ = *(undefined8 *)(piVar43 + -6);
        local_258.val.m_backend.exp = piVar43[-4];
        local_258.val.m_backend.neg = *(bool *)(piVar43 + -3);
        local_258.val.m_backend._72_8_ = *(undefined8 *)(piVar43 + -2);
        local_258._80_8_ = *(undefined8 *)piVar43;
        local_498.val.m_backend.data._M_elems._0_8_ = uVar7;
        local_498.val.m_backend.data._M_elems._8_8_ = uVar8;
        local_498.val.m_backend.data._M_elems._16_8_ = uVar9;
        local_498.val.m_backend.data._M_elems._24_8_ = uVar10;
        local_498.val.m_backend.data._M_elems._32_8_ = uVar11;
        local_498.val.m_backend.data._M_elems._40_8_ = uVar12;
        local_498.val.m_backend.data._M_elems._48_8_ = uVar13;
        local_498.val.m_backend.data._M_elems._56_8_ = uVar14;
        local_498.val.m_backend.exp = iVar48;
        local_498.val.m_backend.neg = bVar3;
        local_498.val.m_backend.fpclass = fVar5;
        local_498.val.m_backend.prec_elem = iVar6;
        local_498._80_8_ = uVar30;
        SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::BreakpointCompare::operator()
                  ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)&local_548,compare,&local_498,&local_258);
        uVar49 = uVar50;
        if (local_548.fpclass == cpp_dec_float_NaN) break;
        boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<long_long>
                  (&local_80,0,(type *)0x0);
        iVar41 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                           (&local_548,&local_80);
        if (iVar41 < 0) break;
        uVar40 = (int)uVar50 + 1;
        uVar50 = (ulong)uVar40;
        piVar43 = piVar43 + 0x16;
        uVar49 = uVar46;
      } while (uVar45 != uVar40);
    }
    uVar50 = uVar49;
    if ((int)uVar49 == start_00) {
      uVar30 = *(undefined8 *)keys[lVar38].val.m_backend.data._M_elems;
      uVar7 = *(undefined8 *)(keys[lVar38].val.m_backend.data._M_elems + 2);
      puVar2 = keys[lVar38].val.m_backend.data._M_elems + 4;
      uVar8 = *(undefined8 *)puVar2;
      uVar9 = *(undefined8 *)(puVar2 + 2);
      puVar2 = keys[lVar38].val.m_backend.data._M_elems + 8;
      uVar10 = *(undefined8 *)puVar2;
      uVar11 = *(undefined8 *)(puVar2 + 2);
      puVar2 = keys[lVar38].val.m_backend.data._M_elems + 0xc;
      uVar12 = *(undefined8 *)puVar2;
      uVar13 = *(undefined8 *)(puVar2 + 2);
      iVar48 = keys[lVar38].val.m_backend.exp;
      bVar3 = keys[lVar38].val.m_backend.neg;
      iVar41 = keys[lVar38].idx;
      BVar36 = keys[lVar38].src;
      uVar14 = *(undefined8 *)((pBVar1->val).m_backend.data._M_elems + 2);
      uVar15 = *(undefined8 *)((pBVar1->val).m_backend.data._M_elems + 4);
      uVar16 = *(undefined8 *)((pBVar1->val).m_backend.data._M_elems + 6);
      uVar17 = *(undefined8 *)((pBVar1->val).m_backend.data._M_elems + 8);
      uVar18 = *(undefined8 *)((pBVar1->val).m_backend.data._M_elems + 10);
      uVar19 = *(undefined8 *)((pBVar1->val).m_backend.data._M_elems + 0xc);
      uVar20 = *(undefined8 *)((pBVar1->val).m_backend.data._M_elems + 0xe);
      *(undefined8 *)keys[lVar38].val.m_backend.data._M_elems =
           *(undefined8 *)(pBVar1->val).m_backend.data._M_elems;
      *(undefined8 *)(keys[lVar38].val.m_backend.data._M_elems + 2) = uVar14;
      puVar2 = keys[lVar38].val.m_backend.data._M_elems + 4;
      *(undefined8 *)puVar2 = uVar15;
      *(undefined8 *)(puVar2 + 2) = uVar16;
      puVar2 = keys[lVar38].val.m_backend.data._M_elems + 8;
      *(undefined8 *)puVar2 = uVar17;
      *(undefined8 *)(puVar2 + 2) = uVar18;
      puVar2 = keys[lVar38].val.m_backend.data._M_elems + 0xc;
      *(undefined8 *)puVar2 = uVar19;
      *(undefined8 *)(puVar2 + 2) = uVar20;
      keys[lVar38].val.m_backend.exp = (pBVar1->val).m_backend.exp;
      keys[lVar38].val.m_backend.neg = (pBVar1->val).m_backend.neg;
      BVar31 = pBVar1->src;
      keys[lVar38].idx = pBVar1->idx;
      keys[lVar38].src = BVar31;
      *(undefined8 *)((pBVar1->val).m_backend.data._M_elems + 0xc) = uVar12;
      *(undefined8 *)((pBVar1->val).m_backend.data._M_elems + 0xe) = uVar13;
      *(undefined8 *)((pBVar1->val).m_backend.data._M_elems + 8) = uVar10;
      *(undefined8 *)((pBVar1->val).m_backend.data._M_elems + 10) = uVar11;
      *(undefined8 *)((pBVar1->val).m_backend.data._M_elems + 4) = uVar8;
      *(undefined8 *)((pBVar1->val).m_backend.data._M_elems + 6) = uVar9;
      *(undefined8 *)(pBVar1->val).m_backend.data._M_elems = uVar30;
      *(undefined8 *)((pBVar1->val).m_backend.data._M_elems + 2) = uVar7;
      (pBVar1->val).m_backend.exp = iVar48;
      (pBVar1->val).m_backend.neg = bVar3;
      fVar5 = keys[lVar38].val.m_backend.fpclass;
      iVar32 = keys[lVar38].val.m_backend.prec_elem;
      iVar6 = (pBVar1->val).m_backend.prec_elem;
      keys[lVar38].val.m_backend.fpclass = (pBVar1->val).m_backend.fpclass;
      keys[lVar38].val.m_backend.prec_elem = iVar6;
      (pBVar1->val).m_backend.fpclass = fVar5;
      (pBVar1->val).m_backend.prec_elem = iVar32;
      pBVar1->idx = iVar41;
      pBVar1->src = BVar36;
      uVar50 = (ulong)(start_00 + 1);
    }
  }
  uVar52 = (uint)uVar53;
  uVar40 = uVar52 - start_00;
  iVar48 = (int)uVar50;
  uVar42 = uVar45 - iVar48;
  if ((int)uVar42 < (int)uVar40) {
    uVar46 = uVar53 & 0xffffffff;
    uVar50 = uVar44;
    uVar42 = uVar40;
    uVar52 = uVar45;
    start_00 = iVar48;
    if ((int)uVar45 <= iVar48) goto LAB_0049140d;
  }
  else {
    uVar44 = uVar50;
    uVar40 = uVar42;
    if ((int)uVar52 <= start_00) goto LAB_0049140d;
  }
  SPxQuicksort<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>::Breakpoint,soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>::BreakpointCompare>
            (keys,uVar52 + 1,compare,start_00,(bool)(~type & 1));
  uVar44 = uVar50;
  uVar40 = uVar42;
LAB_0049140d:
  uVar45 = (uint)uVar46;
  start = (int)uVar44;
  type = (bool)(type ^ 1);
  if ((int)uVar40 < 0x19) goto LAB_00491428;
  goto LAB_00490729;
}

Assistant:

void SPxQuicksort(T* keys, int end, COMPARATOR& compare, int start = 0, bool type = true)
{
   assert(start >= 0);

   /* nothing to sort for less than two elements */
   if(end <= start + 1)
      return;

   /* reduce end position to last element index */
   --end;

   /* use quick-sort for long lists */
   while(end - start >= SOPLEX_SHELLSORTMAX)
   {
      T pivotkey;
      T tmp;
      int lo;
      int hi;
      int mid;

      /* select pivot element */
      mid = start + (end - start) / 2; // Instead of (start + end)/2 because the
      // latter can overflow if start + end >
      // INT_MAX
      pivotkey = keys[mid];

      /* partition the array into elements < pivot [start,hi] and elements >= pivot [lo,end] */
      lo = start;
      hi = end;

      for(;;)
      {
         if(type)
         {
            while(lo < end && compare(keys[lo], pivotkey) < 0)
               lo++;

            while(hi > start && compare(keys[hi], pivotkey) >= 0)
               hi--;
         }
         else
         {
            while(lo < end && compare(keys[lo], pivotkey) <= 0)
               lo++;

            while(hi > start && compare(keys[hi], pivotkey) > 0)
               hi--;
         }

         if(lo >= hi)
            break;

         tmp = keys[lo];
         keys[lo] = keys[hi];
         keys[hi] = tmp;

         lo++;
         hi--;
      }

      assert((hi == lo - 1) || (type && hi == start) || (!type && lo == end));

      /* skip entries which are equal to the pivot element (three partitions, <, =, > than pivot)*/
      if(type)
      {
         while(lo < end && compare(pivotkey, keys[lo]) >= 0)
            lo++;

         /* make sure that we have at least one element in the smaller partition */
         if(lo == start)
         {
            /* everything is greater or equal than the pivot element: move pivot to the left (degenerate case) */
            assert(compare(keys[mid], pivotkey) == 0); /* the pivot element did not change its position */

            tmp = keys[lo];
            keys[lo] = keys[mid];
            keys[mid] = tmp;

            lo++;
         }
      }
      else
      {
         while(hi > start && compare(pivotkey, keys[hi]) <= 0)
            hi--;

         /* make sure that we have at least one element in the smaller partition */
         if(hi == end)
         {
            /* everything is greater or equal than the pivot element: move pivot to the left (degenerate case) */
            assert(compare(keys[mid], pivotkey) == 0); /* the pivot element did not change its position */

            tmp = keys[hi];
            keys[hi] = keys[mid];
            keys[mid] = tmp;

            hi--;
         }
      }

      /* sort the smaller partition by a recursive call, sort the larger part without recursion */
      if(hi - start <= end - lo)
      {
         /* sort [start,hi] with a recursive call */
         if(start < hi)
         {
            SPxQuicksort(keys, hi + 1, compare, start, !type);
         }

         /* now focus on the larger part [lo,end] */
         start = lo;
      }
      else
      {
         if(lo < end)
         {
            SPxQuicksort(keys, end + 1, compare, lo, !type);
         }

         /* now focus on the larger part [start,hi] */
         end = hi;
      }

      type = !type;
   }

   /* use shell sort on the remaining small list */
   if(end - start >= 1)
   {
      SPxShellsort(keys, end, compare, start);
   }


#ifdef CHECK_SORTING

   for(int i = start; i < end; ++i)
      assert(compare(keys[i], keys[i + 1]) <= 0);

#endif
}